

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

void * mz_zip_extract_archive_file_to_heap
                 (char *pZip_filename,char *pArchive_name,size_t *pSize,mz_uint flags)

{
  mz_bool mVar1;
  char *local_a8;
  void *p;
  mz_zip_archive zip_archive;
  int file_index;
  mz_uint flags_local;
  size_t *pSize_local;
  char *pArchive_name_local;
  char *pZip_filename_local;
  
  local_a8 = (char *)0x0;
  if (pSize != (size_t *)0x0) {
    *pSize = 0;
  }
  if ((pZip_filename == (char *)0x0) || (pArchive_name == (char *)0x0)) {
    pZip_filename_local = (char *)0x0;
  }
  else {
    zip_archive.m_pState._4_4_ = flags;
    memset(&p,0,0x70);
    mVar1 = mz_zip_reader_init_file
                      ((mz_zip_archive *)&p,pZip_filename,zip_archive.m_pState._4_4_ | 0x800);
    if (mVar1 == 0) {
      pZip_filename_local = (char *)0x0;
    }
    else {
      zip_archive.m_pState._0_4_ =
           mz_zip_reader_locate_file
                     ((mz_zip_archive *)&p,pArchive_name,(char *)0x0,zip_archive.m_pState._4_4_);
      if (-1 < (int)(mz_uint)zip_archive.m_pState) {
        local_a8 = (char *)mz_zip_reader_extract_to_heap
                                     ((mz_zip_archive *)&p,(mz_uint)zip_archive.m_pState,pSize,
                                      zip_archive.m_pState._4_4_);
      }
      mz_zip_reader_end((mz_zip_archive *)&p);
      pZip_filename_local = local_a8;
    }
  }
  return pZip_filename_local;
}

Assistant:

void *mz_zip_extract_archive_file_to_heap(const char *pZip_filename,
                                          const char *pArchive_name,
                                          size_t *pSize, mz_uint flags) {
  int file_index;
  mz_zip_archive zip_archive;
  void *p = NULL;

  if (pSize)
    *pSize = 0;

  if ((!pZip_filename) || (!pArchive_name))
    return NULL;

  MZ_CLEAR_OBJ(zip_archive);
  if (!mz_zip_reader_init_file(&zip_archive, pZip_filename,
                               flags |
                                   MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY))
    return NULL;

  if ((file_index = mz_zip_reader_locate_file(&zip_archive, pArchive_name, NULL,
                                              flags)) >= 0)
    p = mz_zip_reader_extract_to_heap(&zip_archive, file_index, pSize, flags);

  mz_zip_reader_end(&zip_archive);
  return p;
}